

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O1

void I_SelectTimer(void)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  itimerval itv;
  itimerval local_28;
  
  sem_init((sem_t *)&timerWait,0,0);
  signal(0xe,I_HandleAlarm);
  local_28.it_value.tv_sec = 0;
  local_28.it_interval.tv_sec = 0;
  local_28.it_value.tv_usec = 0x6f9b;
  local_28.it_interval.tv_usec = 0x6f9b;
  iVar1 = setitimer(ITIMER_REAL,&local_28,(itimerval *)0x0);
  bVar5 = iVar1 == 0;
  pcVar2 = I_GetTimePolled;
  if (bVar5) {
    pcVar2 = I_GetTimeSignaled;
  }
  pcVar3 = I_FreezeTimePolled;
  if (bVar5) {
    pcVar3 = I_FreezeTimeSignaled;
  }
  pcVar4 = I_WaitForTicPolled;
  if (bVar5) {
    pcVar4 = I_WaitForTicSignaled;
  }
  I_GetTime = pcVar2;
  I_FreezeTime = pcVar3;
  I_WaitForTic = pcVar4;
  return;
}

Assistant:

void I_SelectTimer()
{
	SEMAPHORE_INIT(timerWait, 0, 0)
#ifndef __sun
	signal(SIGALRM, I_HandleAlarm);
#else
	struct sigaction alrmaction;
	sigaction(SIGALRM, NULL, &alrmaction);
	alrmaction.sa_handler = I_HandleAlarm;
	sigaction(SIGALRM, &alrmaction, NULL);
#endif

	struct itimerval itv;
	itv.it_interval.tv_sec = itv.it_value.tv_sec = 0;
	itv.it_interval.tv_usec = itv.it_value.tv_usec = 1000000/TICRATE;

	if (setitimer(ITIMER_REAL, &itv, NULL) != 0)
	{
		I_GetTime = I_GetTimePolled;
		I_FreezeTime = I_FreezeTimePolled;
		I_WaitForTic = I_WaitForTicPolled;
	}
	else
	{
		I_GetTime = I_GetTimeSignaled;
		I_FreezeTime = I_FreezeTimeSignaled;
		I_WaitForTic = I_WaitForTicSignaled;
	}
}